

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::shl<unsigned_int>
          (uintwide_t<256U,_unsigned_short,_void,_false> *this,uint n)

{
  ushort uVar1;
  uint uVar2;
  const_iterator first;
  const_iterator it;
  unsigned_short *puVar3;
  iterator puVar4;
  unsigned_short *dest;
  iterator it_00;
  byte bVar5;
  local_integral_type right_shift_previous_value;
  unsigned_short *puStack_48;
  unsigned_short t;
  unsigned_short *ai;
  limb_type_conflict part_from_previous_value;
  unsigned_fast_type left_shift_amount;
  ulong local_28;
  unsigned_long local_20;
  unsigned_long offset;
  uintwide_t<256U,_unsigned_short,_void,_false> *puStack_10;
  uint n_local;
  uintwide_t<256U,_unsigned_short,_void,_false> *this_local;
  
  local_28 = (ulong)(n >> 4);
  left_shift_amount = 0x10;
  offset._4_4_ = n;
  puStack_10 = this;
  local_20 = detail::min_unsafe<unsigned_long>(&local_28,&left_shift_amount);
  uVar2 = offset._4_4_ & 0xf;
  bVar5 = (byte)offset._4_4_ & 0xf;
  if (local_20 != 0) {
    first = detail::array_detail::array<unsigned_short,_16UL>::cbegin
                      ((array<unsigned_short,_16UL> *)this);
    it = detail::array_detail::array<unsigned_short,_16UL>::cbegin
                   ((array<unsigned_short,_16UL> *)this);
    puVar3 = detail::advance_and_point<unsigned_short_const*,unsigned_int>(it,0x10 - (int)local_20);
    puVar4 = detail::array_detail::array<unsigned_short,_16UL>::begin
                       ((array<unsigned_short,_16UL> *)this);
    dest = detail::advance_and_point<unsigned_short*,unsigned_int>(puVar4,0x10);
    detail::copy_backward_unsafe<unsigned_short_const*,unsigned_short*>(first,puVar3,dest);
    puVar4 = detail::array_detail::array<unsigned_short,_16UL>::begin
                       ((array<unsigned_short,_16UL> *)this);
    it_00 = detail::array_detail::array<unsigned_short,_16UL>::begin
                      ((array<unsigned_short,_16UL> *)this);
    puVar3 = detail::advance_and_point<unsigned_short*,unsigned_int>(it_00,(uint)local_20);
    detail::fill_unsafe<unsigned_short*,unsigned_short>(puVar4,puVar3,0);
  }
  if (uVar2 != 0) {
    ai._6_2_ = 0;
    puVar4 = detail::array_detail::array<unsigned_short,_16UL>::begin
                       ((array<unsigned_short,_16UL> *)this);
    puStack_48 = detail::advance_and_point<unsigned_short*,unsigned_long>(puVar4,local_20);
    while (puVar4 = detail::array_detail::array<unsigned_short,_16UL>::end
                              ((array<unsigned_short,_16UL> *)this), puStack_48 != puVar4) {
      uVar1 = *puStack_48;
      *puStack_48 = uVar1 << bVar5 | ai._6_2_;
      ai._6_2_ = (ushort)((int)(uint)uVar1 >> (0x10 - bVar5 & 0x1f));
      puStack_48 = puStack_48 + 1;
    }
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }